

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O2

int EncodeAlphaInternal(uint8_t *data,int width,int height,int method,int filter,int reduce_levels,
                       int effort_level,uint8_t *tmp_alpha,FilterTrial *result)

{
  VP8BitWriter *bw;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  byte bVar6;
  uint8_t *size;
  bool bVar7;
  uint8_t *local_1e0;
  VP8LBitWriter tmp_bw;
  WebPConfig config;
  WebPPicture local_130;
  
  if (WebPFilters[filter] != (WebPFilterFunc)0x0) {
    (*WebPFilters[filter])(data,width,height,width,tmp_alpha);
    data = tmp_alpha;
  }
  size = (uint8_t *)(long)(height * width);
  if (method == 0) {
    iVar2 = 0;
    bVar1 = true;
    local_1e0 = data;
LAB_00157bd5:
    bVar5 = (char)iVar2 + (char)filter * '\x04';
    bVar6 = bVar5 | 0x10;
    if (reduce_levels == 0) {
      bVar6 = bVar5;
    }
    local_130.use_argb = CONCAT31(local_130.use_argb._1_3_,bVar6);
    bw = &result->bw;
    iVar2 = VP8BitWriterInit(bw,(size_t)(size + 1));
    if ((iVar2 == 0) || (iVar2 = VP8BitWriterAppend(bw,(uint8_t *)&local_130,1), iVar2 == 0)) {
      bVar7 = false;
    }
    else {
      iVar2 = VP8BitWriterAppend(bw,local_1e0,(size_t)size);
      bVar7 = iVar2 != 0;
    }
    if (!bVar1) {
      VP8LBitWriterWipeOut(&tmp_bw);
    }
    uVar3 = 0;
    if (bVar7) {
      uVar3 = (uint)((result->bw).error_ == 0);
    }
    result->score = (result->bw).pos_;
    return uVar3;
  }
  iVar2 = VP8LBitWriterInit(&tmp_bw,(ulong)size >> 3);
  if ((iVar2 != 0) && (iVar2 = WebPPictureInitInternal(&local_130,0x210), iVar2 != 0)) {
    local_130.stats = &result->stats;
    local_130.use_argb = 1;
    local_130.width = width;
    local_130.height = height;
    iVar2 = WebPPictureAlloc(&local_130);
    if (iVar2 != 0) {
      (*WebPDispatchAlphaToGreen)
                (data,width,local_130.width,local_130.height,local_130.argb,local_130.argb_stride);
      iVar2 = WebPConfigInitInternal(&config,WEBP_PRESET_DEFAULT,75.0,0x210);
      if (iVar2 != 0) {
        iVar2 = 1;
        config.method = effort_level;
        if (effort_level == 6 && reduce_levels == 0) {
          config.quality = 100.0;
        }
        else {
          config.quality = (float)effort_level * 8.0;
        }
        config.lossless = iVar2;
        config.exact = iVar2;
        iVar4 = VP8LEncodeStream(&config,&local_130,&tmp_bw);
        WebPPictureFree(&local_130);
        if ((iVar4 != 0) && (tmp_bw.error_ == 0)) {
          local_1e0 = VP8LBitWriterFinish(&tmp_bw);
          if (tmp_bw.error_ != 0) {
            VP8LBitWriterWipeOut(&tmp_bw);
            (result->bw).max_pos_ = 0;
            *(undefined8 *)&(result->bw).error_ = 0;
            (result->bw).buf_ = (uint8_t *)0x0;
            (result->bw).pos_ = 0;
            (result->bw).range_ = 0;
            (result->bw).value_ = 0;
            (result->bw).run_ = 0;
            (result->bw).nb_bits_ = 0;
            return 0;
          }
          if (size < tmp_bw.cur_ + ((long)(tmp_bw.used_ + 7 >> 3) - (long)tmp_bw.buf_)) {
            VP8LBitWriterWipeOut(&tmp_bw);
            iVar2 = 0;
            bVar1 = true;
            local_1e0 = data;
          }
          else {
            bVar1 = false;
            size = tmp_bw.cur_ + ((long)(tmp_bw.used_ + 7 >> 3) - (long)tmp_bw.buf_);
          }
          goto LAB_00157bd5;
        }
        VP8LBitWriterWipeOut(&tmp_bw);
      }
    }
  }
  VP8LBitWriterWipeOut(&tmp_bw);
  (result->bw).max_pos_ = 0;
  *(undefined8 *)&(result->bw).error_ = 0;
  (result->bw).buf_ = (uint8_t *)0x0;
  (result->bw).pos_ = 0;
  (result->bw).range_ = 0;
  (result->bw).value_ = 0;
  (result->bw).run_ = 0;
  (result->bw).nb_bits_ = 0;
  return 0;
}

Assistant:

static int EncodeAlphaInternal(const uint8_t* const data, int width, int height,
                               int method, int filter, int reduce_levels,
                               int effort_level,  // in [0..6] range
                               uint8_t* const tmp_alpha,
                               FilterTrial* result) {
  int ok = 0;
  const uint8_t* alpha_src;
  WebPFilterFunc filter_func;
  uint8_t header;
  const size_t data_size = width * height;
  const uint8_t* output = NULL;
  size_t output_size = 0;
  VP8LBitWriter tmp_bw;

  assert((uint64_t)data_size == (uint64_t)width * height);  // as per spec
  assert(filter >= 0 && filter < WEBP_FILTER_LAST);
  assert(method >= ALPHA_NO_COMPRESSION);
  assert(method <= ALPHA_LOSSLESS_COMPRESSION);
  assert(sizeof(header) == ALPHA_HEADER_LEN);

  filter_func = WebPFilters[filter];
  if (filter_func != NULL) {
    filter_func(data, width, height, width, tmp_alpha);
    alpha_src = tmp_alpha;
  }  else {
    alpha_src = data;
  }

  if (method != ALPHA_NO_COMPRESSION) {
    ok = VP8LBitWriterInit(&tmp_bw, data_size >> 3);
    ok = ok && EncodeLossless(alpha_src, width, height, effort_level,
                              !reduce_levels, &tmp_bw, &result->stats);
    if (ok) {
      output = VP8LBitWriterFinish(&tmp_bw);
      if (tmp_bw.error_) {
        VP8LBitWriterWipeOut(&tmp_bw);
        memset(&result->bw, 0, sizeof(result->bw));
        return 0;
      }
      output_size = VP8LBitWriterNumBytes(&tmp_bw);
      if (output_size > data_size) {
        // compressed size is larger than source! Revert to uncompressed mode.
        method = ALPHA_NO_COMPRESSION;
        VP8LBitWriterWipeOut(&tmp_bw);
      }
    } else {
      VP8LBitWriterWipeOut(&tmp_bw);
      memset(&result->bw, 0, sizeof(result->bw));
      return 0;
    }
  }

  if (method == ALPHA_NO_COMPRESSION) {
    output = alpha_src;
    output_size = data_size;
    ok = 1;
  }

  // Emit final result.
  header = method | (filter << 2);
  if (reduce_levels) header |= ALPHA_PREPROCESSED_LEVELS << 4;

  if (!VP8BitWriterInit(&result->bw, ALPHA_HEADER_LEN + output_size)) ok = 0;
  ok = ok && VP8BitWriterAppend(&result->bw, &header, ALPHA_HEADER_LEN);
  ok = ok && VP8BitWriterAppend(&result->bw, output, output_size);

  if (method != ALPHA_NO_COMPRESSION) {
    VP8LBitWriterWipeOut(&tmp_bw);
  }
  ok = ok && !result->bw.error_;
  result->score = VP8BitWriterSize(&result->bw);
  return ok;
}